

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O1

int CoreVsnprintf(CPalThread *pthrCurrent,LPSTR Buffer,size_t Count,LPCSTR Format,
                 __va_list_tag *aparg)

{
  LPCWSTR lpWideCharStr;
  char *__s;
  FILE *pFVar1;
  uint uVar2;
  INT IVar3;
  char cVar4;
  BOOL BVar5;
  int iVar6;
  DWORD DVar7;
  CPalThread *pCVar8;
  WCHAR *pWVar9;
  INT *pIVar10;
  uint *puVar11;
  byte *pbVar12;
  undefined8 *puVar13;
  size_t sVar14;
  short *psVar15;
  int *piVar16;
  ulong uVar17;
  undefined8 uVar18;
  uint uVar19;
  LPCSTR pCVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  bool bVar22;
  CPalThread *pCStack_4a8;
  CHAR TempBuffer [5];
  uint local_490;
  int local_48c;
  INT Prefix;
  INT Type;
  LPCSTR Fmt;
  LPSTR local_478;
  WCHAR local_46e;
  uint local_46c;
  uint uStack_468;
  WCHAR TempWChar;
  INT Flags;
  INT Precision;
  INT Width;
  undefined1 auStack_458 [8];
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  auStack_458 = *(undefined1 (*) [8])aparg;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  cVar4 = *Format;
  _Prefix = Format;
  _Precision = (CPalThread *)Buffer;
  if (cVar4 == '\0') {
    bVar22 = true;
  }
  else {
    pCVar20 = (LPCSTR)(long)(int)Count;
    local_478 = Buffer + Count;
    bVar22 = false;
    Fmt = pCVar20;
    do {
      if ((bVar22) || ((long)pCVar20 <= (long)_Precision - (long)Buffer)) {
        bVar22 = true;
        break;
      }
      if ((cVar4 == '%') &&
         (BVar5 = Internal_ExtractFormatA
                            (pthrCurrent,(LPCSTR *)&Prefix,local_438,(LPINT)&local_46c,&Flags,
                             (LPINT)&stack0xfffffffffffffb98,(LPINT)&local_490,&local_48c),
         uVar18 = ap[0]._0_8_, IVar3 = Flags, uVar19 = local_46c, iVar6 = local_48c,
         uVar2 = local_490, BVar5 != 0)) {
        if (local_48c == 2 && (local_490 ^ 2) == 0) {
          if (Flags == -3) {
            if ((uint)auStack_458._0_4_ < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          else if (Flags == -2) {
            uVar21 = (ulong)auStack_458 & 0xffffffff;
            if (uVar21 < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              pIVar10 = (INT *)(uVar21 + (long)ap[0].overflow_arg_area);
            }
            else {
              pIVar10 = (INT *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            Flags = *pIVar10;
          }
          if (uStack_468 == 0xfffffffc) {
            if ((uint)auStack_458._0_4_ < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          else if (uStack_468 == 0xfffffffe) {
            uVar21 = (ulong)auStack_458 & 0xffffffff;
            if (uVar21 < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              puVar11 = (uint *)(uVar21 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar11 = (uint *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            uStack_468 = *puVar11;
          }
          uVar21 = (ulong)auStack_458 & 0xffffffff;
          if (uVar21 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            puVar13 = (undefined8 *)(uVar21 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar13 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpWideCharStr = (LPCWSTR)*puVar13;
          iVar6 = WideCharToMultiByte(0,0,lpWideCharStr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
          if (iVar6 == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x663);
            pFVar1 = _stderr;
            DVar7 = GetLastError();
            fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
            goto LAB_003187f4;
          }
          pthrCurrent = (CPalThread *)CorUnix::InternalMalloc((long)iVar6);
          uVar2 = uStack_468;
          if (pthrCurrent == (CPalThread *)0x0) {
            if (PAL_InitializeChakraCoreCalled == false) {
              abort();
            }
            piVar16 = __errno_location();
            *piVar16 = 8;
            goto LAB_003187f4;
          }
          pCVar8 = pthrCurrent;
          uVar19 = 0;
          if (uStack_468 == 0xfffffffd) {
LAB_003182bc:
            *(undefined1 *)&((__va_list_tag *)&pCVar8->_vptr_CPalThread)->gp_offset = 0;
          }
          else {
            uVar19 = iVar6 - 1;
            if ((0 < (int)uStack_468) && ((int)uStack_468 < (int)uVar19)) {
              iVar6 = WideCharToMultiByte(0,0,lpWideCharStr,uStack_468,(LPSTR)pthrCurrent,iVar6,
                                          (LPCSTR)0x0,(LPBOOL)0x0);
              if (iVar6 != 0) {
                pCVar8 = (CPalThread *)
                         ((long)&((__va_list_tag *)&pthrCurrent->_vptr_CPalThread)->gp_offset +
                         (long)iVar6);
                uVar19 = uVar2;
                goto LAB_003182bc;
              }
              uVar18 = 0x67d;
LAB_003188d3:
              fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,uVar18);
              pFVar1 = _stderr;
              DVar7 = GetLastError();
              fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
              CorUnix::InternalFree(pthrCurrent);
              goto LAB_003187f4;
            }
            iVar6 = WideCharToMultiByte(0,0,lpWideCharStr,-1,(LPSTR)pthrCurrent,iVar6,(LPCSTR)0x0,
                                        (LPBOOL)0x0);
            if (iVar6 == 0) {
              uVar18 = 0x68d;
              goto LAB_003188d3;
            }
          }
          BVar5 = Internal_AddPaddingA
                            ((LPSTR *)&Precision,(int)local_478 - Precision,(LPSTR)pthrCurrent,
                             Flags - uVar19,local_46c);
          bVar22 = BVar5 == 0;
          CorUnix::InternalFree(pthrCurrent);
          pCVar20 = Fmt;
        }
        else if ((local_490 ^ 2) == 0 && local_48c == 1) {
          if (Flags + 3U < 2) {
            if ((uint)auStack_458._0_4_ < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          if ((uStack_468 & 0xfffffffd) == 0xfffffffc) {
            if ((uint)auStack_458._0_4_ < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
            }
            else {
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
          }
          uVar21 = (ulong)auStack_458 & 0xffffffff;
          if (uVar21 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            pWVar9 = (WCHAR *)(uVar21 + (long)ap[0].overflow_arg_area);
          }
          else {
            pWVar9 = (WCHAR *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_46e = *pWVar9;
          iVar6 = WideCharToMultiByte(0,0,&local_46e,1,(LPSTR)&pCStack_4a8,5,(LPCSTR)0x0,(LPBOOL)0x0
                                     );
          if (iVar6 == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreVsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x6b6);
            pFVar1 = _stderr;
            DVar7 = GetLastError();
            fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar7);
            goto LAB_003187f4;
          }
          TempBuffer[(long)iVar6 + -8] = '\0';
          pthrCurrent = (CPalThread *)&Precision;
          BVar5 = Internal_AddPaddingA
                            ((LPSTR *)pthrCurrent,(int)local_478 - Precision,(LPSTR)&pCStack_4a8,
                             IVar3 - iVar6,local_46c);
          bVar22 = BVar5 == 0;
        }
        else {
          if (local_48c == 6) {
            if (Flags == -2) {
              uVar21 = (ulong)auStack_458 & 0xffffffff;
              if (uVar21 < 0x29) {
                auStack_458._0_4_ = auStack_458._0_4_ + 8;
                pIVar10 = (INT *)(uVar21 + (long)ap[0].overflow_arg_area);
              }
              else {
                pIVar10 = (INT *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              Flags = *pIVar10;
            }
            if (uStack_468 == 0xfffffffe) {
              uVar21 = (ulong)auStack_458 & 0xffffffff;
              if (uVar21 < 0x29) {
                auStack_458._0_4_ = auStack_458._0_4_ + 8;
                puVar11 = (uint *)(uVar21 + (long)ap[0].overflow_arg_area);
              }
              else {
                puVar11 = (uint *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              uStack_468 = *puVar11;
            }
            uVar21 = (ulong)auStack_458 & 0xffffffff;
            if (local_490 == 1) {
              if ((uint)auStack_458._0_4_ < 0x29) {
                auStack_458._0_4_ = auStack_458._0_4_ + 8;
                puVar13 = (undefined8 *)(uVar21 + (long)ap[0].overflow_arg_area);
              }
              else {
                puVar13 = (undefined8 *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              *(short *)*puVar13 = (short)((long)_Precision - (long)Buffer);
            }
            else {
              if ((uint)auStack_458._0_4_ < 0x29) {
                auStack_458._0_4_ = auStack_458._0_4_ + 8;
                puVar13 = (undefined8 *)(uVar21 + (long)ap[0].overflow_arg_area);
              }
              else {
                puVar13 = (undefined8 *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              *(int *)*puVar13 = (int)((long)_Precision - (long)Buffer);
            }
            goto LAB_00318034;
          }
          if ((local_48c == 1) && ((local_46c & 4) != 0)) {
            uVar21 = (ulong)auStack_458 & 0xffffffff;
            if (uVar21 < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              pbVar12 = (byte *)(uVar21 + (long)ap[0].overflow_arg_area);
            }
            else {
              pbVar12 = (byte *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            pCStack_4a8._0_2_ = (ushort)*pbVar12;
            pthrCurrent = (CPalThread *)&Precision;
            BVar5 = Internal_AddPaddingA
                              ((LPSTR *)pthrCurrent,(int)local_478 - Precision,(LPSTR)&pCStack_4a8,
                               Flags + -1,local_46c);
            bVar22 = BVar5 == 0;
          }
          else if ((local_48c == 2) && ((local_46c & 4) != 0)) {
            uVar21 = (ulong)auStack_458 & 0xffffffff;
            if (uVar21 < 0x29) {
              auStack_458._0_4_ = auStack_458._0_4_ + 8;
              puVar13 = (undefined8 *)(uVar21 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar13 = (undefined8 *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            __s = (char *)*puVar13;
            sVar14 = strlen(__s);
            pthrCurrent = (CPalThread *)&Precision;
            BVar5 = Internal_AddPaddingA
                              ((LPSTR *)pthrCurrent,(int)local_478 - Precision,__s,
                               Flags - (int)sVar14,uVar19);
            bVar22 = BVar5 == 0;
            pCVar20 = Fmt;
          }
          else {
            uVar21 = (long)local_478 - (long)_Precision;
            if (0x3fffffff < uVar21) {
              uVar21 = 0x40000000;
            }
            pthrCurrent = _Precision;
            if (local_48c == 5 && (local_490 ^ 1) == 0) {
              uVar17 = (ulong)auStack_458 & 0xffffffff;
              if (uVar17 < 0x29) {
                auStack_458._0_4_ = auStack_458._0_4_ + 8;
                psVar15 = (short *)(uVar17 + (long)ap[0].overflow_arg_area);
              }
              else {
                psVar15 = (short *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              uVar19 = snprintf((char *)_Precision,uVar21,local_438,(long)*psVar15);
            }
            else if ((local_490 ^ 1) == 0 && local_48c == 4) {
              uVar17 = (ulong)auStack_458 & 0xffffffff;
              if (uVar17 < 0x29) {
                auStack_458._0_4_ = auStack_458._0_4_ + 8;
                psVar15 = (short *)(uVar17 + (long)ap[0].overflow_arg_area);
              }
              else {
                psVar15 = (short *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              uVar19 = snprintf((char *)_Precision,uVar21,local_438,(ulong)(uint)(int)*psVar15);
            }
            else {
              pCStack_4a8 = (CPalThread *)auStack_458;
              TempBuffer[0] = (undefined1)ap[0].gp_offset;
              TempBuffer[1] = ap[0].gp_offset._1_1_;
              TempBuffer[2] = ap[0].gp_offset._2_1_;
              TempBuffer[3] = ap[0].gp_offset._3_1_;
              stack0xfffffffffffffb64 = ap[0].fp_offset;
              ap[0]._0_8_ = uVar18;
              uVar19 = vsnprintf((char *)_Precision,uVar21,local_438,&pCStack_4a8);
              pthrCurrent = (CPalThread *)auStack_458;
              PAL_printf_arg_remover((va_list *)pthrCurrent,Flags,uStack_468,iVar6,uVar2);
            }
            if (((int)uVar19 < 0) || (uVar21 <= uVar19)) {
              bVar22 = true;
            }
            else {
              bVar22 = false;
              uVar21 = (ulong)uVar19;
            }
            _Precision = (CPalThread *)
                         ((long)&((__va_list_tag *)&_Precision->_vptr_CPalThread)->gp_offset +
                         uVar21);
            pCVar20 = Fmt;
          }
        }
      }
      else {
        *(char *)&((__va_list_tag *)&_Precision->_vptr_CPalThread)->gp_offset = *_Prefix;
        _Prefix = _Prefix + 1;
        _Precision = (CPalThread *)
                     ((long)&((__va_list_tag *)&_Precision->_vptr_CPalThread)->gp_offset + 1);
LAB_00318034:
        bVar22 = false;
      }
      cVar4 = *_Prefix;
    } while (cVar4 != '\0');
    bVar22 = !bVar22;
  }
  if ((long)_Precision - (long)Buffer < (long)(int)Count) {
    *(undefined1 *)&((__va_list_tag *)&_Precision->_vptr_CPalThread)->gp_offset = 0;
  }
  if (bVar22) {
    iVar6 = Precision - (int)Buffer;
  }
  else {
    piVar16 = __errno_location();
    *piVar16 = 0x22;
LAB_003187f4:
    iVar6 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == TempBuff._1016_8_) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int CoreVsnprintf(CPalThread *pthrCurrent, LPSTR Buffer, size_t Count, LPCSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPSTR BufferPtr = Buffer;
    LPCSTR Fmt = Format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    va_list ap;

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (BufferRanOut || (BufferPtr - Buffer) >= static_cast<int>(Count)) //Count is assumed to be in the range of int
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatA(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1, 0,
                                             0, 0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) InternalMalloc(Length);
                if (!TempStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = WideCharToMultiByte(CP_ACP, 0, TempWStr,
                                                 Precision, TempStr, Length,
                                                 0, 0);
                    if (!Length)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = WideCharToMultiByte(CP_ACP, 0, TempWStr, -1,
                                                       TempStr, Length, 0, 0);
                    if (!wctombResult)
                    {
                        ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempStr,
                                                   Width - Length,
                                                   Flags);

                InternalFree(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[5];

                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = WideCharToMultiByte(CP_ACP, 0, &TempWChar, 1,
                                             TempBuffer, sizeof(TempBuffer),
                                             0, 0);
                if (!Length)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                          GetLastError());
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempBuffer,
                                                   Width - Length,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           ch,
                                           Width - Length,
                                           Flags);
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           tempStr,
                                           Width - Length,
                                           Flags);
            }
            else
            {
                // Types that sprintf can handle
                size_t TempCount = Count - (BufferPtr - Buffer);

#if !HAVE_LARGE_SNPRINTF_SUPPORT
                // Limit TempCount to 0x40000000, which is sufficient
                // for platforms on which snprintf fails for very large
                // sizes.
                if (TempCount > 0x40000000)
                {
                    TempCount = 0x40000000;
                }
#endif  // HAVE_LARGE_SNPRINTF_SUPPORT

                TempInt = 0;
                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short) trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vsnprintf(BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    BufferPtr += TempInt;
                }
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (static_cast<int>(Count) > (BufferPtr - Buffer)) //Count is assumed to be in the range of int
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        errno = ERANGE;
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}